

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O3

spv_ext_inst_type_t spvExtInstImportTypeGet(char *name)

{
  int iVar1;
  spv_ext_inst_type_t sVar2;
  
  iVar1 = strcmp("GLSL.std.450",name);
  if (iVar1 == 0) {
    sVar2 = SPV_EXT_INST_TYPE_GLSL_STD_450;
  }
  else {
    iVar1 = strcmp("OpenCL.std",name);
    if (iVar1 == 0) {
      sVar2 = SPV_EXT_INST_TYPE_OPENCL_STD;
    }
    else {
      iVar1 = strcmp("SPV_AMD_shader_explicit_vertex_parameter",name);
      if (iVar1 == 0) {
        sVar2 = SPV_EXT_INST_TYPE_SPV_AMD_SHADER_EXPLICIT_VERTEX_PARAMETER;
      }
      else {
        iVar1 = strcmp("SPV_AMD_shader_trinary_minmax",name);
        if (iVar1 == 0) {
          sVar2 = SPV_EXT_INST_TYPE_SPV_AMD_SHADER_TRINARY_MINMAX;
        }
        else {
          iVar1 = strcmp("SPV_AMD_gcn_shader",name);
          if (iVar1 == 0) {
            sVar2 = SPV_EXT_INST_TYPE_SPV_AMD_GCN_SHADER;
          }
          else {
            iVar1 = strcmp("SPV_AMD_shader_ballot",name);
            if (iVar1 == 0) {
              sVar2 = SPV_EXT_INST_TYPE_SPV_AMD_SHADER_BALLOT;
            }
            else {
              iVar1 = strcmp("DebugInfo",name);
              if (iVar1 == 0) {
                sVar2 = SPV_EXT_INST_TYPE_DEBUGINFO;
              }
              else {
                iVar1 = strcmp("OpenCL.DebugInfo.100",name);
                if (iVar1 == 0) {
                  sVar2 = SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100;
                }
                else {
                  iVar1 = strcmp("NonSemantic.Shader.DebugInfo.100",name);
                  if (iVar1 == 0) {
                    sVar2 = SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100;
                  }
                  else {
                    iVar1 = strncmp("NonSemantic.ClspvReflection.",name,0x1c);
                    if (iVar1 == 0) {
                      sVar2 = SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION;
                    }
                    else {
                      iVar1 = strncmp("NonSemantic.VkspReflection.",name,0x1b);
                      if (iVar1 == 0) {
                        sVar2 = SPV_EXT_INST_TYPE_NONSEMANTIC_VKSPREFLECTION;
                      }
                      else {
                        iVar1 = strncmp("NonSemantic.",name,0xc);
                        sVar2 = SPV_EXT_INST_TYPE_NONSEMANTIC_UNKNOWN;
                        if (iVar1 != 0) {
                          sVar2 = SPV_EXT_INST_TYPE_NONE;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return sVar2;
}

Assistant:

spv_ext_inst_type_t spvExtInstImportTypeGet(const char* name) {
  // The names are specified by the respective extension instruction
  // specifications.
  if (!strcmp("GLSL.std.450", name)) {
    return SPV_EXT_INST_TYPE_GLSL_STD_450;
  }
  if (!strcmp("OpenCL.std", name)) {
    return SPV_EXT_INST_TYPE_OPENCL_STD;
  }
  if (!strcmp("SPV_AMD_shader_explicit_vertex_parameter", name)) {
    return SPV_EXT_INST_TYPE_SPV_AMD_SHADER_EXPLICIT_VERTEX_PARAMETER;
  }
  if (!strcmp("SPV_AMD_shader_trinary_minmax", name)) {
    return SPV_EXT_INST_TYPE_SPV_AMD_SHADER_TRINARY_MINMAX;
  }
  if (!strcmp("SPV_AMD_gcn_shader", name)) {
    return SPV_EXT_INST_TYPE_SPV_AMD_GCN_SHADER;
  }
  if (!strcmp("SPV_AMD_shader_ballot", name)) {
    return SPV_EXT_INST_TYPE_SPV_AMD_SHADER_BALLOT;
  }
  if (!strcmp("DebugInfo", name)) {
    return SPV_EXT_INST_TYPE_DEBUGINFO;
  }
  if (!strcmp("OpenCL.DebugInfo.100", name)) {
    return SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100;
  }
  if (!strcmp("NonSemantic.Shader.DebugInfo.100", name)) {
    return SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100;
  }
  if (!strncmp("NonSemantic.ClspvReflection.", name, 28)) {
    return SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION;
  }
  if (!strncmp("NonSemantic.VkspReflection.", name, 27)) {
    return SPV_EXT_INST_TYPE_NONSEMANTIC_VKSPREFLECTION;
  }
  // ensure to add any known non-semantic extended instruction sets
  // above this point, and update spvExtInstIsNonSemantic()
  if (!strncmp("NonSemantic.", name, 12)) {
    return SPV_EXT_INST_TYPE_NONSEMANTIC_UNKNOWN;
  }
  return SPV_EXT_INST_TYPE_NONE;
}